

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point.cc
# Opt level: O3

unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> __thiscall
lf::geometry::Point::SubGeometry(Point *this,dim_t codim,dim_t i)

{
  _func_int **pp_Var1;
  runtime_error *this_00;
  int in_ECX;
  undefined4 in_register_00000034;
  stringstream ss;
  string local_200;
  string local_1e0;
  string local_1c0;
  DenseStorage<double,__1,__1,_1,_0> local_1a0;
  ostream local_190 [376];
  
  if (i == 0 && in_ECX == 0) {
    pp_Var1 = (_func_int **)operator_new(0x18);
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
              (&local_1a0,
               (DenseStorage<double,__1,__1,_1,_0> *)(CONCAT44(in_register_00000034,codim) + 8));
    *pp_Var1 = (_func_int *)&PTR_DimLocal_003cfb18;
    pp_Var1[1] = (_func_int *)local_1a0.m_data;
    pp_Var1[2] = (_func_int *)local_1a0.m_rows;
    (this->super_Geometry)._vptr_Geometry = pp_Var1;
    return (__uniq_ptr_data<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>,_true,_true>
            )(__uniq_ptr_data<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>,_true,_true>
              )this;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"codim or i out of bounds.",0x19);
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"false","");
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_200,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/point.cc"
             ,"");
  std::__cxx11::stringbuf::str();
  base::AssertionFailed(&local_1e0,&local_200,0x1b,&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"this code should not be reached");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::unique_ptr<Geometry> Point::SubGeometry(dim_t codim, dim_t i) const {
  if (codim == 0 && i == 0) {
    return std::make_unique<Point>(coord_);
  }
  LF_VERIFY_MSG(false, "codim or i out of bounds.");
}